

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::replace_selection_(Fl_Text_Buffer *this,Fl_Text_Selection *sel,char *text)

{
  int iVar1;
  int local_34;
  int local_30;
  int end;
  int start;
  Fl_Text_Selection oldSelection;
  char *text_local;
  Fl_Text_Selection *sel_local;
  Fl_Text_Buffer *this_local;
  
  end = sel->mStart;
  unique0x00012004 = sel->mEnd;
  oldSelection.mStart = *(int *)&sel->mSelected;
  oldSelection._4_8_ = text;
  iVar1 = Fl_Text_Selection::position(sel,&local_30,&local_34);
  if (iVar1 != 0) {
    replace(this,local_30,local_34,(char *)oldSelection._4_8_);
    sel->mSelected = false;
    redisplay_selection(this,(Fl_Text_Selection *)&end,sel);
  }
  return;
}

Assistant:

void Fl_Text_Buffer::replace_selection_(Fl_Text_Selection * sel,
					const char *text)
{
  Fl_Text_Selection oldSelection = *sel;
  
  /* If there's no selection, return */
  int start, end;
  if (!sel->position(&start, &end))
    return;
  
  /* Do the appropriate type of replace */
    replace(start, end, text);
  
  /* Unselect (happens automatically in BufReplace, but BufReplaceRect
   can't detect when the contents of a selection goes away) */
  sel->mSelected = 0;
  redisplay_selection(&oldSelection, sel);
}